

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_get_u64le(CBS *cbs,uint64_t *out)

{
  ulong uVar1;
  uint8_t *puVar2;
  size_t i;
  long lVar3;
  ulong uVar4;
  
  uVar1 = cbs->len;
  if (7 < uVar1) {
    puVar2 = cbs->data;
    cbs->data = puVar2 + 8;
    cbs->len = uVar1 - 8;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = (ulong)puVar2[lVar3] | uVar4 << 8;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    *out = uVar4;
    if (7 < uVar1) {
      uVar1 = *out;
      *out = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int cbs_get(CBS *cbs, const uint8_t **p, size_t n) {
  if (cbs->len < n) {
    return 0;
  }

  *p = cbs->data;
  cbs->data += n;
  cbs->len -= n;
  return 1;
}